

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  Expression *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined7 uVar7;
  DistItem *__cur_1;
  pointer pDVar8;
  pointer pDVar9;
  pointer pDVar10;
  pointer pDVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    pEVar12 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar13 = (long)pos - (long)this->data_;
  pDVar8 = (pointer)operator_new((long)pEVar12 << 5);
  pEVar3 = args->value;
  uVar4 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar5 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar8 + lVar13 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar5;
  *(undefined8 *)((long)pDVar8 + lVar13) = pEVar3;
  ((undefined8 *)((long)pDVar8 + lVar13))[1] = uVar4;
  pDVar11 = this->data_;
  pDVar9 = pDVar11 + this->len;
  pDVar10 = pDVar8;
  if (pDVar9 == pos) {
    for (; pDVar11 != pos; pDVar11 = pDVar11 + 1) {
      pEVar3 = pDVar11->value;
      uVar4 = *(undefined8 *)
               &(pDVar11->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar6 = (pDVar11->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar7 = *(undefined7 *)
               &(pDVar11->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar11->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar6;
      *(undefined7 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar7;
      pDVar10->value = pEVar3;
      *(undefined8 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar4;
      pDVar10 = pDVar10 + 1;
    }
  }
  else {
    for (; pDVar11 != pos; pDVar11 = pDVar11 + 1) {
      pEVar3 = pDVar11->value;
      uVar4 = *(undefined8 *)
               &(pDVar11->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar6 = (pDVar11->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar7 = *(undefined7 *)
               &(pDVar11->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar11->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar6;
      *(undefined7 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar7;
      pDVar10->value = pEVar3;
      *(undefined8 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar4;
      pDVar10 = pDVar10 + 1;
    }
    puVar1 = (undefined8 *)(lVar13 + (long)pDVar8);
    for (; pos != pDVar9; pos = pos + 1) {
      pEVar3 = pos->value;
      uVar4 = *(undefined8 *)
               &(pos->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      uVar5 = *(undefined8 *)
               &(pos->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      puVar1[6] = (pos->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload._M_value.expr;
      puVar1[7] = uVar5;
      puVar1[4] = pEVar3;
      puVar1[5] = uVar4;
      puVar1 = puVar1 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar12;
  this->data_ = pDVar8;
  return (pointer)((long)pDVar8 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}